

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

QString * __thiscall
QTzTimeZonePrivate::abbreviation
          (QString *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 atMSecsSinceEpoch)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  Data local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  data(&local_48,this,atMSecsSinceEpoch);
  qVar5 = local_48.abbreviation.d.size;
  uVar1 = local_48.abbreviation.d.d._0_4_;
  uVar2 = local_48.abbreviation.d.d._4_4_;
  uVar3 = local_48.abbreviation.d.ptr._0_4_;
  uVar4 = local_48.abbreviation.d.ptr._4_4_;
  local_48.abbreviation.d.d = (Data *)0x0;
  local_48.abbreviation.d.ptr = (char16_t *)0x0;
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar1;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar2;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar3;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar4;
  local_48.abbreviation.d.size = 0;
  (__return_storage_ptr__->d).size = qVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTzTimeZonePrivate::abbreviation(qint64 atMSecsSinceEpoch) const
{
    return data(atMSecsSinceEpoch).abbreviation;
}